

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O2

int mbedtls_cipher_cmac_finish(mbedtls_cipher_context_t *ctx,uchar *output)

{
  uchar *buf;
  mbedtls_cmac_context_t *output_00;
  ulong uVar1;
  int iVar2;
  size_t j;
  ulong uVar3;
  uchar *input2;
  uchar *input1;
  ulong block_size;
  uchar M_last [16];
  uchar K1 [16];
  uchar K2 [16];
  size_t olen;
  
  iVar2 = -0x6100;
  if (((ctx != (mbedtls_cipher_context_t *)0x0) &&
      (ctx->cipher_info != (mbedtls_cipher_info_t *)0x0)) &&
     (output_00 = ctx->cmac_ctx,
     output != (uchar *)0x0 && output_00 != (mbedtls_cmac_context_t *)0x0)) {
    block_size = (ulong)ctx->cipher_info->block_size;
    mbedtls_platform_zeroize(K1,0x10);
    mbedtls_platform_zeroize(K2,0x10);
    cmac_generate_subkeys(ctx,K1,K2);
    buf = output_00->unprocessed_block;
    uVar1 = output_00->unprocessed_len;
    if (uVar1 < block_size) {
      for (uVar3 = 0; block_size != uVar3; uVar3 = uVar3 + 1) {
        if (uVar3 < uVar1) {
          M_last[uVar3] = buf[uVar3];
        }
        else if (uVar3 == uVar1) {
          M_last[uVar1] = 0x80;
        }
        else {
          M_last[uVar3] = '\0';
        }
      }
      input2 = K2;
      input1 = M_last;
    }
    else {
      input2 = K1;
      input1 = buf;
    }
    cmac_xor_block(M_last,input1,input2,block_size);
    cmac_xor_block(output_00->state,M_last,output_00->state,block_size);
    iVar2 = mbedtls_cipher_update(ctx,output_00->state,block_size,output_00->state,&olen);
    if (iVar2 == 0) {
      memcpy(output,output_00,block_size);
    }
    mbedtls_platform_zeroize(K1,0x10);
    mbedtls_platform_zeroize(K2,0x10);
    output_00->unprocessed_len = 0;
    mbedtls_platform_zeroize(buf,0x10);
    mbedtls_platform_zeroize(output_00,0x10);
  }
  return iVar2;
}

Assistant:

int mbedtls_cipher_cmac_finish( mbedtls_cipher_context_t *ctx,
                                unsigned char *output )
{
    mbedtls_cmac_context_t* cmac_ctx;
    unsigned char *state, *last_block;
    unsigned char K1[MBEDTLS_CIPHER_BLKSIZE_MAX];
    unsigned char K2[MBEDTLS_CIPHER_BLKSIZE_MAX];
    unsigned char M_last[MBEDTLS_CIPHER_BLKSIZE_MAX];
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t olen, block_size;

    if( ctx == NULL || ctx->cipher_info == NULL || ctx->cmac_ctx == NULL ||
        output == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    cmac_ctx = ctx->cmac_ctx;
    block_size = ctx->cipher_info->block_size;
    state = cmac_ctx->state;

    mbedtls_platform_zeroize( K1, sizeof( K1 ) );
    mbedtls_platform_zeroize( K2, sizeof( K2 ) );
    cmac_generate_subkeys( ctx, K1, K2 );

    last_block = cmac_ctx->unprocessed_block;

    /* Calculate last block */
    if( cmac_ctx->unprocessed_len < block_size )
    {
        cmac_pad( M_last, block_size, last_block, cmac_ctx->unprocessed_len );
        cmac_xor_block( M_last, M_last, K2, block_size );
    }
    else
    {
        /* Last block is complete block */
        cmac_xor_block( M_last, last_block, K1, block_size );
    }


    cmac_xor_block( state, M_last, state, block_size );
    if( ( ret = mbedtls_cipher_update( ctx, state, block_size, state,
                                       &olen ) ) != 0 )
    {
        goto exit;
    }

    memcpy( output, state, block_size );

exit:
    /* Wipe the generated keys on the stack, and any other transients to avoid
     * side channel leakage */
    mbedtls_platform_zeroize( K1, sizeof( K1 ) );
    mbedtls_platform_zeroize( K2, sizeof( K2 ) );

    cmac_ctx->unprocessed_len = 0;
    mbedtls_platform_zeroize( cmac_ctx->unprocessed_block,
                              sizeof( cmac_ctx->unprocessed_block ) );

    mbedtls_platform_zeroize( state, MBEDTLS_CIPHER_BLKSIZE_MAX );
    return( ret );
}